

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O1

char * pdgui_strnescape(char *dst,size_t dstlen,char *src,size_t srclen)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar3 = 0;
  if (src == (char *)0x0 || dst == (char *)0x0) {
    return (char *)0x0;
  }
  uVar1 = dstlen - 1;
  uVar5 = 0;
  do {
    bVar2 = src[uVar3];
    uVar6 = uVar5;
    if ((bVar2 - 0x5b < 0x23) && ((0x500000007U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)) {
      uVar6 = (ulong)((int)uVar5 + 1);
      dst[uVar5] = '\\';
      if (uVar6 <= uVar1) goto LAB_00178531;
      dst[uVar5] = '\0';
LAB_0017854f:
      bVar7 = false;
    }
    else {
LAB_00178531:
      dst[uVar6] = bVar2;
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
      if (srclen - 1 < uVar3 || bVar2 == 0) goto LAB_0017854f;
      bVar7 = uVar4 <= uVar1;
    }
    uVar5 = uVar6;
    if (!bVar7) {
      uVar3 = dstlen - 1;
      if (uVar6 <= uVar1) {
        uVar3 = uVar6;
      }
      dst[uVar3] = '\0';
      return dst;
    }
  } while( true );
}

Assistant:

char* pdgui_strnescape(char *dst, size_t dstlen, const char *src, size_t srclen)
{
    unsigned ptin = 0, ptout = 0;
    if(!dst || !src)return 0;
    while(1)
    {
        int c = src[ptin];
        if (c == '\\' || c == '{' || c == '}' || c == '[' || c == ']') {
            dst[ptout++] = '\\';
            if (dstlen && ptout >= dstlen){
                dst[ptout-1] = 0;
                break;
            }
        }
        dst[ptout] = c;
        ptin++;
        ptout++;
        if (c==0) break;
        if (srclen && ptin  >= srclen) break;
        if (dstlen && ptout >= dstlen) break;
    }

    if(!dstlen || ptout < dstlen)
        dst[ptout]=0;
    else
        dst[dstlen-1]=0;

    return dst;
}